

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_factory.hpp
# Opt level: O1

AngularQuad IntegratorXX::angular_from_string(string *name)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  runtime_error *this;
  AngularQuad AVar4;
  size_type sVar5;
  
  sVar1 = name->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (name->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar3 = toupper((int)pcVar2[sVar5]);
      pcVar2[sVar5] = (char)iVar3;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  iVar3 = std::__cxx11::string::compare((char *)name);
  AVar4 = AhrensBeylkin;
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)name);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)name);
      if (iVar3 == 0) {
        AVar4 = Delley;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)name);
        AVar4 = LebedevLaikov;
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)name);
          if (iVar3 != 0) {
            iVar3 = std::__cxx11::string::compare((char *)name);
            if (iVar3 != 0) {
              iVar3 = std::__cxx11::string::compare((char *)name);
              AVar4 = Womersley;
              if (iVar3 != 0) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this,"Unrecognized Angular Quadrature");
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
            }
          }
        }
      }
    }
  }
  return AVar4;
}

Assistant:

AngularQuad angular_from_string(std::string name) {
  std::transform(name.begin(), name.end(), name.begin(), ::toupper);
  if(name == "AHRENSBEYLKIN") return AngularQuad::AhrensBeylkin;
  if(name == "AB")            return AngularQuad::AhrensBeylkin;
  if(name == "DELLEY")        return AngularQuad::Delley;
  if(name == "LEBEDEVLAIKOV") return AngularQuad::LebedevLaikov;
  if(name == "LEBEDEV")       return AngularQuad::LebedevLaikov;
  if(name == "LL")            return AngularQuad::LebedevLaikov;
  if(name == "WOMERSLEY")     return AngularQuad::Womersley;

  throw std::runtime_error("Unrecognized Angular Quadrature");
}